

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

void set_iterator_next(set_iterator it)

{
  ulong uVar1;
  bucket pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (it != (set_iterator)0x0) {
    uVar4 = it->current_bucket;
    uVar1 = it->s->capacity;
    lVar5 = uVar4 * 0x18 + 0x10;
    while (uVar4 < uVar1) {
      pbVar2 = it->s->buckets;
      if (((*(long *)((long)&pbVar2->count + lVar5) != 0) &&
          (uVar3 = *(ulong *)((long)pbVar2 + lVar5 + -0x10), uVar3 != 0)) &&
         (it->current_pair < uVar3)) {
        it->current_pair = it->current_pair + 1;
        return;
      }
      uVar4 = uVar4 + 1;
      it->current_bucket = uVar4;
      lVar5 = lVar5 + 0x18;
    }
  }
  return;
}

Assistant:

void set_iterator_next(set_iterator it)
{
	if (it != NULL)
	{
		for (; it->current_bucket < it->s->capacity; ++it->current_bucket)
		{
			bucket b = &it->s->buckets[it->current_bucket];

			if (b->pairs != NULL && b->count > 0)
			{
				for (; it->current_pair < b->count; ++it->current_pair)
				{
					pair p = &b->pairs[it->current_pair];

					if (p != NULL)
					{
						++it->current_pair;

						return;
					}
				}
			}
		}
	}
}